

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::BitwiseAnd(uint32_t rowSizeIn1,uint32_t rowSizeIn2,uint32_t rowSizeOut,uint8_t *in1Y,
                    uint8_t *in2Y,uint8_t *outY,uint8_t *outYEnd,uint32_t simdWidth,
                    uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [32];
  byte *pbVar2;
  undefined1 (*in_RCX) [32];
  uint in_EDX;
  uint in_ESI;
  uint in_EDI;
  undefined1 (*in_R8) [32];
  uint8_t *in_R9;
  uint8_t *outXEnd;
  simd *dst;
  simd *src2;
  simd *src1;
  byte *local_130;
  byte *local_128;
  byte *local_120;
  uint8_t *local_110;
  undefined1 (*local_108) [32];
  undefined1 (*local_100) [32];
  uint8_t *local_f8;
  undefined1 (*local_f0) [32];
  undefined1 (*local_e8) [32];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  local_f0 = in_R8;
  local_e8 = in_RCX;
  for (local_f8 = in_R9; local_f8 != outXEnd; local_f8 = local_f8 + in_EDX) {
    local_108 = local_f0;
    local_110 = local_f8;
    for (local_100 = local_e8; local_100 != local_e8 + ((ulong)outYEnd & 0xffffffff);
        local_100 = local_100 + 1) {
      auVar1 = vpand_avx2(*local_100,*local_108);
      local_c0 = auVar1._0_8_;
      uStack_b8 = auVar1._8_8_;
      uStack_b0 = auVar1._16_8_;
      uStack_a8 = auVar1._24_8_;
      *(undefined8 *)local_110 = local_c0;
      *(undefined8 *)(local_110 + 8) = uStack_b8;
      *(undefined8 *)(local_110 + 0x10) = uStack_b0;
      *(undefined8 *)(local_110 + 0x18) = uStack_a8;
      local_108 = local_108 + 1;
      local_110 = local_110 + 0x20;
    }
    if (totalSimdWidth != 0) {
      local_120 = *local_e8 + simdWidth;
      local_128 = *local_f0 + simdWidth;
      local_130 = local_f8 + simdWidth;
      pbVar2 = local_130 + totalSimdWidth;
      for (; local_130 != pbVar2; local_130 = local_130 + 1) {
        *local_130 = *local_120 & *local_128;
        local_120 = local_120 + 1;
        local_128 = local_128 + 1;
      }
    }
    local_e8 = (undefined1 (*) [32])(*local_e8 + in_EDI);
    local_f0 = (undefined1 (*) [32])(*local_f0 + in_ESI);
  }
  return;
}

Assistant:

void BitwiseAnd( uint32_t rowSizeIn1, uint32_t rowSizeIn2, uint32_t rowSizeOut, const uint8_t * in1Y, const uint8_t * in2Y,
                     uint8_t * outY, const uint8_t * outYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        for( ; outY != outYEnd; outY += rowSizeOut, in1Y += rowSizeIn1, in2Y += rowSizeIn2 ) {
            const simd * src1 = reinterpret_cast <const simd*> (in1Y);
            const simd * src2 = reinterpret_cast <const simd*> (in2Y);
            simd       * dst  = reinterpret_cast <simd*> (outY);

            const simd * src1End = src1 + simdWidth;

            for( ; src1 != src1End; ++src1, ++src2, ++dst )
                _mm256_storeu_si256( dst, _mm256_and_si256( _mm256_loadu_si256( src1 ), _mm256_loadu_si256( src2 ) ) );

            if( nonSimdWidth > 0 ) {
                const uint8_t * in1X = in1Y + totalSimdWidth;
                const uint8_t * in2X = in2Y + totalSimdWidth;
                uint8_t       * outX = outY + totalSimdWidth;

                const uint8_t * outXEnd = outX + nonSimdWidth;

                for( ; outX != outXEnd; ++outX, ++in1X, ++in2X )
                    (*outX) = (*in1X) & (*in2X);
            }
        }
    }